

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O0

void Amap_ManCreateMuxChoices
               (Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1,Amap_Obj_t *pFanC,
               Amap_Obj_t **pChoices)

{
  Amap_Obj_t *pAVar1;
  Amap_Obj_t *pAVar2;
  Amap_Obj_t *pFanC_00;
  Amap_Obj_t **pChoices_local;
  Amap_Obj_t *pFanC_local;
  Amap_Obj_t *pFan1_local;
  Amap_Obj_t *pFan0_local;
  Amap_Man_t *p_local;
  
  pAVar1 = Amap_ManCreateMux(p,pFan0,pFan1,pFanC);
  *pChoices = pAVar1;
  pAVar1 = Amap_Not(pFan0);
  pAVar2 = Amap_Not(pFan1);
  pAVar1 = Amap_ManCreateMux(p,pAVar1,pAVar2,pFanC);
  pChoices[1] = pAVar1;
  pAVar1 = Amap_Not(pFanC);
  pAVar1 = Amap_ManCreateMux(p,pFan1,pFan0,pAVar1);
  pChoices[2] = pAVar1;
  pAVar1 = Amap_Not(pFan1);
  pAVar2 = Amap_Not(pFan0);
  pFanC_00 = Amap_Not(pFanC);
  pAVar1 = Amap_ManCreateMux(p,pAVar1,pAVar2,pFanC_00);
  pChoices[3] = pAVar1;
  return;
}

Assistant:

void Amap_ManCreateMuxChoices( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1, Amap_Obj_t * pFanC, Amap_Obj_t * pChoices[] )
{
    pChoices[0] = Amap_ManCreateMux( p, pFan0,           pFan1,           pFanC           );
    pChoices[1] = Amap_ManCreateMux( p, Amap_Not(pFan0), Amap_Not(pFan1), pFanC           );
    pChoices[2] = Amap_ManCreateMux( p, pFan1,           pFan0,           Amap_Not(pFanC) );
    pChoices[3] = Amap_ManCreateMux( p, Amap_Not(pFan1), Amap_Not(pFan0), Amap_Not(pFanC) );
}